

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::ConcurrentImageAtomicCase::
genComputeSource_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  _anonymous_namespace_ *this_00;
  ostream *poVar1;
  Context *context;
  char *in_RCX;
  string local_1c0 [48];
  ostringstream local_190 [8];
  ostringstream buf;
  ConcurrentImageAtomicCase *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"${GLSL_VERSION_DECL}\n");
  poVar1 = std::operator<<(poVar1,"${SHADER_IMAGE_ATOMIC_REQUIRE}\n");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,
                           "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n");
  poVar1 = std::operator<<(poVar1,
                           "layout (binding = 1, std430) writeonly buffer IntermediateResults\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  poVar1 = std::operator<<(poVar1,"\thighp uint values[");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,*(int *)((long)this + 0x7c) * *(int *)((long)this + 0x7c));
  poVar1 = std::operator<<(poVar1,"];\n");
  poVar1 = std::operator<<(poVar1,"} sb_ires;\n");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,
                           "layout (binding = 2, r32ui) volatile uniform highp uimage2D u_workImage;\n"
                          );
  poVar1 = std::operator<<(poVar1,"uniform highp uint u_atomicDelta;\n");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"void main ()\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  poVar1 = std::operator<<(poVar1,
                           "\thighp uint invocationIndex = gl_GlobalInvocationID.x + gl_GlobalInvocationID.y * uint("
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)((long)this + 0x7c));
  poVar1 = std::operator<<(poVar1,");\n");
  poVar1 = std::operator<<(poVar1,
                           "\tsb_ires.values[invocationIndex] = imageAtomicAdd(u_workImage, ivec2(gl_GlobalInvocationID.xy), u_atomicDelta);\n"
                          );
  std::operator<<(poVar1,"}");
  this_00 = *(_anonymous_namespace_ **)((long)this + 0x70);
  std::__cxx11::ostringstream::str();
  context = (Context *)std::__cxx11::string::c_str();
  specializeShader_abi_cxx11_(__return_storage_ptr__,this_00,context,in_RCX);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string ConcurrentImageAtomicCase::genComputeSource (void) const
{
	std::ostringstream buf;

	buf	<< "${GLSL_VERSION_DECL}\n"
		<< "${SHADER_IMAGE_ATOMIC_REQUIRE}\n"
		<< "\n"
		<< "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
		<< "layout (binding = 1, std430) writeonly buffer IntermediateResults\n"
		<< "{\n"
		<< "	highp uint values[" << m_workSize * m_workSize << "];\n"
		<< "} sb_ires;\n"
		<< "\n"
		<< "layout (binding = 2, r32ui) volatile uniform highp uimage2D u_workImage;\n"
		<< "uniform highp uint u_atomicDelta;\n"
		<< "\n"
		<< "void main ()\n"
		<< "{\n"
		<< "	highp uint invocationIndex = gl_GlobalInvocationID.x + gl_GlobalInvocationID.y * uint(" << m_workSize <<");\n"
		<< "	sb_ires.values[invocationIndex] = imageAtomicAdd(u_workImage, ivec2(gl_GlobalInvocationID.xy), u_atomicDelta);\n"
		<< "}";

	return specializeShader(m_context, buf.str().c_str());
}